

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execBitDxEa<(moira::Instr)29,(moira::Mode)4,(moira::Size)4>(Moira *this,u16 opcode)

{
  int *piVar1;
  byte bVar2;
  u32 addr;
  u32 uVar3;
  u32 uVar4;
  uint n;
  
  n = opcode & 7;
  bVar2 = *(byte *)((long)this->exec + (ulong)(opcode >> 9 & 7) * 4 + -0x58);
  addr = computeEA<(moira::Mode)4,(moira::Size)1,0ul>(this,n);
  uVar3 = readM<(moira::MemSpace)1,(moira::Size)1,0ul>(this,addr);
  piVar1 = (int *)((long)this->exec + (ulong)n * 4 + -0x38);
  *piVar1 = *piVar1 + (-1 - (uint)((~(uint)opcode & 7) == 0));
  (this->reg).sr.z = (uVar3 >> (bVar2 & 7) & 1) == 0;
  uVar4 = (this->reg).pc;
  (this->reg).pc0 = uVar4;
  (this->queue).ird = (this->queue).irc;
  uVar4 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar4 + 2);
  (this->queue).irc = (u16)uVar4;
  writeM<(moira::MemSpace)1,(moira::Size)1,4ul>(this,addr,uVar3 ^ 1 << (bVar2 & 7));
  return;
}

Assistant:

void
Moira::execBitDxEa(u16 opcode)
{
    int src = ____xxx_________(opcode);
    int dst = _____________xxx(opcode);

    switch (M) {

        case 0:
        {
            u8 b = readD(src) & 0b11111;
            u32 data = readD(dst);
            data = bit<I>(data, b);

            prefetch<POLLIPL>();

            sync(cyclesBit<I>(b));
            if (I != BTST) writeD(dst, data);
            break;
        }
        default:
        {
            u8 b = readD(src) & 0b111;

            u32 ea, data;
            if (!readOp<M, Byte>(dst, ea, data)) return;

            data = bit<I>(data, b);

            if (I != BTST) {
                prefetch();
                writeM<M, Byte, POLLIPL>(ea, data);
            } else {
                prefetch<POLLIPL>();
            }
        }
    }
}